

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::EncodeNormals(ObjEncoder *this)

{
  bool bVar1;
  uint uVar2;
  PointAttribute *this_00;
  AttributeValueIndex i;
  AttributeValueIndex att_id;
  bool bVar3;
  array<float,_3UL> value;
  
  this_00 = PointCloud::GetNamedAttribute(this->in_point_cloud_,NORMAL);
  bVar3 = true;
  if ((this_00 != (PointAttribute *)0x0) && (uVar2 = this_00->num_unique_entries_, uVar2 != 0)) {
    att_id.value_ = 0;
    while (bVar3 = uVar2 <= att_id.value_, !bVar3) {
      bVar1 = GeometryAttribute::ConvertValue<float,3>
                        (&this_00->super_GeometryAttribute,att_id,value._M_elems);
      if (!bVar1) {
        return bVar3;
      }
      EncoderBuffer::Encode(this->out_buffer_,"vn ",3);
      EncodeFloatList(this,value._M_elems,3);
      EncoderBuffer::Encode(this->out_buffer_,"\n",1);
      att_id.value_ = att_id.value_ + 1;
      uVar2 = this_00->num_unique_entries_;
    }
    this->normal_att_ = this_00;
  }
  return bVar3;
}

Assistant:

bool ObjEncoder::EncodeNormals() {
  const PointAttribute *const att =
      in_point_cloud_->GetNamedAttribute(GeometryAttribute::NORMAL);
  if (att == nullptr || att->size() == 0) {
    return true;  // It's OK if we don't have normals.
  }
  std::array<float, 3> value;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(att->size()); ++i) {
    if (!att->ConvertValue<float, 3>(i, &value[0])) {
      return false;
    }
    buffer()->Encode("vn ", 3);
    EncodeFloatList(&value[0], 3);
    buffer()->Encode("\n", 1);
  }
  normal_att_ = att;
  return true;
}